

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

void hashSeed(uint8_t *digest,uint8_t *inputSeed,uint8_t *salt,uint8_t hashPrefix,uint repIndex,
             uint nodeIndex,picnic_instance_t *params)

{
  hash_context ctx;
  undefined6 in_stack_fffffffffffffef8;
  uint16_t in_stack_fffffffffffffefe;
  hash_context *in_stack_ffffffffffffff00;
  
  hash_init_prefix(in_stack_ffffffffffffff00,
                   CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),'\0');
  hash_update(in_stack_ffffffffffffff00,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),0x159aec);
  hash_update(in_stack_ffffffffffffff00,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),0x159b01);
  hash_update_uint16_le(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  hash_update_uint16_le(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  hash_final((hash_context *)0x159b2d);
  hash_squeeze(in_stack_ffffffffffffff00,
               (uint8_t *)CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),0x159b4e);
  return;
}

Assistant:

static void hashSeed(uint8_t* digest, const uint8_t* inputSeed, uint8_t* salt, uint8_t hashPrefix,
                     unsigned int repIndex, unsigned int nodeIndex,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, hashPrefix);
  hash_update(&ctx, inputSeed, params->seed_size);
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, repIndex);
  hash_update_uint16_le(&ctx, nodeIndex);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, 2 * params->seed_size);
  hash_clear(&ctx);
}